

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section_helper.hpp
# Opt level: O2

string * export_section<(pstore::repo::section_kind)0>
                   (string *__return_storage_ptr__,database *db,string_mapping *exported_strings,
                   section_content *content,bool comments)

{
  string *psVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  ostringstream os;
  generic_section *local_b0;
  undefined1 local_a8 [32];
  not_null<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*> local_88;
  ostringstream local_80;
  
  local_88.ptr_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8;
  local_a8._16_8_ = (pointer)0x0;
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (pointer)0x0;
  pstore::gsl::not_null<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>::
  ensure_invariant(&local_88);
  build_section<(pstore::repo::section_kind)0,pstore::repo::generic_section,pstore::repo::generic_section_creation_dispatcher>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b0,
             (section_content *)local_88.ptr_);
  pstore::exchange::export_ns::ostringstream::ostringstream(&local_80);
  pstore::exchange::export_ns::
  emit_section<(pstore::repo::section_kind)0,pstore::exchange::export_ns::ostringstream,pstore::repo::generic_section>
            (&local_80,(indent)0x0,db,exported_strings,local_b0,comments);
  psVar1 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&local_80);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  pstore::exchange::export_ns::ostringstream::~ostringstream(&local_80);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::string export_section (pstore::database const & db,
                            pstore::exchange::export_ns::string_mapping const & exported_strings,
                            pstore::repo::section_content const & content, bool comments) {
    // First build the section that we want to export.
    std::vector<std::uint8_t> buffer;
    auto const section = build_section<Kind> (&buffer, content);

    // Now export it.
    using namespace pstore::exchange::export_ns;
    ostringstream os;
    emit_section<Kind> (os, indent{}, db, exported_strings, *section, comments);
    return os.str ();
}